

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O0

void testing::internal::ContainerPrinter::
     PrintValue<std::vector<wchar_t,std::allocator<wchar_t>>,void>
               (vector<wchar_t,_std::allocator<wchar_t>_> *container,ostream *os)

{
  bool bVar1;
  reference value;
  wchar_t *elem;
  const_iterator __end0;
  const_iterator __begin0;
  vector<wchar_t,_std::allocator<wchar_t>_> *__range3;
  size_t count;
  size_t kMaxCount;
  ostream *os_local;
  vector<wchar_t,_std::allocator<wchar_t>_> *container_local;
  
  std::operator<<(os,'{');
  __range3 = (vector<wchar_t,_std::allocator<wchar_t>_> *)0x0;
  __end0 = std::vector<wchar_t,_std::allocator<wchar_t>_>::begin(container);
  elem = (wchar_t *)std::vector<wchar_t,_std::allocator<wchar_t>_>::end(container);
  do {
    bVar1 = __gnu_cxx::operator==<const_wchar_t_*,_std::vector<wchar_t,_std::allocator<wchar_t>_>_>
                      (&__end0,(__normal_iterator<const_wchar_t_*,_std::vector<wchar_t,_std::allocator<wchar_t>_>_>
                                *)&elem);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
LAB_004dfbd7:
      if (__range3 != (vector<wchar_t,_std::allocator<wchar_t>_> *)0x0) {
        std::operator<<(os,' ');
      }
      std::operator<<(os,'}');
      return;
    }
    value = __gnu_cxx::
            __normal_iterator<const_wchar_t_*,_std::vector<wchar_t,_std::allocator<wchar_t>_>_>::
            operator*(&__end0);
    if ((__range3 != (vector<wchar_t,_std::allocator<wchar_t>_> *)0x0) &&
       (std::operator<<(os,','), __range3 == (vector<wchar_t,_std::allocator<wchar_t>_> *)0x20)) {
      std::operator<<(os," ...");
      goto LAB_004dfbd7;
    }
    std::operator<<(os,' ');
    UniversalPrint<wchar_t>(value,os);
    __range3 = (vector<wchar_t,_std::allocator<wchar_t>_> *)
               &(__range3->super__Vector_base<wchar_t,_std::allocator<wchar_t>_>)._M_impl.field_0x1;
    __gnu_cxx::__normal_iterator<const_wchar_t_*,_std::vector<wchar_t,_std::allocator<wchar_t>_>_>::
    operator++(&__end0);
  } while( true );
}

Assistant:

static void PrintValue(const T& container, std::ostream* os) {
    const size_t kMaxCount = 32;  // The maximum number of elements to print.
    *os << '{';
    size_t count = 0;
    for (auto&& elem : container) {
      if (count > 0) {
        *os << ',';
        if (count == kMaxCount) {  // Enough has been printed.
          *os << " ...";
          break;
        }
      }
      *os << ' ';
      // We cannot call PrintTo(elem, os) here as PrintTo() doesn't
      // handle `elem` being a native array.
      internal::UniversalPrint(elem, os);
      ++count;
    }

    if (count > 0) {
      *os << ' ';
    }
    *os << '}';
  }